

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CDict *cdict;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ZSTD_CCtx_params *pZVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  ZSTD_CCtx_params in_stack_fffffffffffffef8;
  ZSTD_CCtx_params params;
  
  lVar4 = 0x10;
  pZVar5 = &zcs->requestedParams;
  pZVar6 = &params;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = (pZVar5->cParams).windowLog;
    pZVar6->format = pZVar5->format;
    (pZVar6->cParams).windowLog = uVar1;
    pZVar5 = (ZSTD_CCtx_params *)&(pZVar5->cParams).chainLog;
    pZVar6 = (ZSTD_CCtx_params *)&(pZVar6->cParams).chainLog;
  }
  params.fParams.contentSizeFlag = 1;
  cdict = zcs->cdict;
  pZVar5 = &params;
  puVar7 = (undefined8 *)&stack0xfffffffffffffef8;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = *(undefined8 *)pZVar5;
    pZVar5 = (ZSTD_CCtx_params *)&(pZVar5->cParams).chainLog;
    puVar7 = puVar7 + 1;
  }
  sVar2 = ZSTD_resetCStream_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffef8,
                     -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize);
  return sVar2;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (unsigned)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}